

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_context.hpp
# Opt level: O2

error_code __thiscall
pstore::exchange::import_ns::context::apply_patches(context *this,transaction_base *t)

{
  uint uVar1;
  error_category *peVar2;
  error_category *extraout_RDX;
  list<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>_>_>
  *this_00;
  ulong uVar3;
  _List_node_base *p_Var4;
  error_code eVar5;
  
  this_00 = &this->patches;
  p_Var4 = (_List_node_base *)this_00;
  do {
    p_Var4 = (((_List_base<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>_>_>
                *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)this_00) {
      std::__cxx11::
      list<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::patcher,_std::default_delete<pstore::exchange::import_ns::patcher>_>_>_>
      ::clear(this_00);
      uVar3 = 0;
      peVar2 = (error_category *)std::_V2::system_category();
      goto LAB_00116561;
    }
    uVar1 = (**(code **)(*(long *)p_Var4[1]._M_next + 0x10))(p_Var4[1]._M_next,t);
  } while (uVar1 == 0);
  uVar3 = (ulong)uVar1;
  peVar2 = extraout_RDX;
LAB_00116561:
  eVar5._M_cat = peVar2;
  eVar5._0_8_ = uVar3;
  return eVar5;
}

Assistant:

std::error_code apply_patches (transaction_base * const t) {
                    for (auto const & patch : patches) {
                        if (std::error_code const erc = (*patch) (t)) {
                            return erc;
                        }
                    }
                    // Ensure that we can't apply the patches more than once.
                    patches.clear ();
                    return {};
                }